

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

value * __thiscall
mjs::interpreter::impl::operator()
          (value *__return_storage_ptr__,impl *this,array_literal_expression *e)

{
  gc_heap *pgVar1;
  value *pvVar2;
  pointer puVar3;
  long *plVar4;
  uint32_t index;
  uint32_t index_00;
  mjs *this_00;
  object_ptr a;
  value val;
  gc_heap_ptr_untyped local_c0;
  undefined1 local_b0 [40];
  wstring_view local_88;
  wchar_t *local_78;
  anon_union_32_5_7b1e0779_for_value_3 local_70;
  value *local_50;
  array_literal_expression *local_48;
  wstring_view local_40;
  
  this_00 = (mjs *)0x0;
  local_50 = __return_storage_ptr__;
  make_array((gc_heap_ptr<mjs::global_object> *)&local_c0,(int)this + 0x20);
  puVar3 = (e->elements_).
           super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = e;
  if ((e->elements_).
      super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
    do {
      if (puVar3[(long)this_00]._M_t.
          super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
          super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
          super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl == (expression *)0x0) {
        plVar4 = (long *)gc_heap_ptr_untyped::get(&local_c0);
        pgVar1 = this->heap_;
        index_string_abi_cxx11_((wstring *)local_b0,this_00,index_00);
        local_88._M_len = local_b0._8_8_;
        local_88._M_str = (wchar_t *)local_b0._0_8_;
        string::string((string *)&local_78,pgVar1,&local_88);
        (**(code **)(*plVar4 + 8))(plVar4,(value *)&local_78,&value::undefined,0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_78);
        if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ * 4 + 4);
        }
      }
      else {
        eval((value *)&local_78,this,
             puVar3[(long)this_00]._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
        get_value((value *)local_b0,this,(value *)&local_78);
        value::destroy((value *)&local_78);
        plVar4 = (long *)gc_heap_ptr_untyped::get(&local_c0);
        pgVar1 = this->heap_;
        index_string_abi_cxx11_((wstring *)&local_78,this_00,index);
        local_40._M_len = (size_t)local_70.n_;
        local_40._M_str = local_78;
        string::string((string *)&local_88,pgVar1,&local_40);
        (**(code **)(*plVar4 + 8))(plVar4,&local_88,local_b0,0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_88);
        if (local_78 !=
            (wchar_t *)&local_70.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
           ) {
          operator_delete(local_78,local_70._8_8_ * 4 + 4);
        }
        value::destroy((value *)local_b0);
      }
      this_00 = (mjs *)(ulong)((int)this_00 + 1);
      puVar3 = (local_48->elements_).
               super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (this_00 < (mjs *)((long)(local_48->elements_).
                                     super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)
            );
  }
  pvVar2 = local_50;
  local_50->type_ = object;
  (local_50->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       local_c0.heap_;
  *(uint32_t *)((long)&local_50->field_1 + 8) = local_c0.pos_;
  if (local_c0.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_c0.heap_,(gc_heap_ptr_untyped *)&(local_50->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c0);
  return pvVar2;
}

Assistant:

value operator()(const array_literal_expression& e) {
        auto a = make_array(global_, 0);
        const auto& es = e.elements();
        for (unsigned i = 0; i < es.size(); ++i) {
            if (es[i]) {
                auto val = get_value(eval(*es[i]));
                a->put(string{heap_, index_string(i)}, val);
            } else {
                a->put(string{heap_, index_string(i)}, value::undefined);
            }
        }
        return value{a};
    }